

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxScript.cpp
# Opt level: O0

void __thiscall
Jinx::Impl::Script::CallBytecodeFunction
          (Script *this,FunctionDefinitionPtr *fnDef,OnReturn onReturn)

{
  reference pvVar1;
  element_type *peVar2;
  size_t sVar3;
  size_type sVar4;
  OnReturn onReturn_local;
  FunctionDefinitionPtr *fnDef_local;
  Script *this_local;
  
  std::
  vector<Jinx::Impl::Script::ExecutionFrame,Jinx::StaticAllocator<Jinx::Impl::Script::ExecutionFrame,4096ul,16ul>>
  ::emplace_back<std::shared_ptr<Jinx::Impl::FunctionDefinition>const&>
            ((vector<Jinx::Impl::Script::ExecutionFrame,Jinx::StaticAllocator<Jinx::Impl::Script::ExecutionFrame,4096ul,16ul>>
              *)&this->m_execution,fnDef);
  pvVar1 = std::
           vector<Jinx::Impl::Script::ExecutionFrame,_Jinx::StaticAllocator<Jinx::Impl::Script::ExecutionFrame,_4096UL,_16UL>_>
           ::back(&this->m_execution);
  pvVar1->onReturn = onReturn;
  pvVar1 = std::
           vector<Jinx::Impl::Script::ExecutionFrame,_Jinx::StaticAllocator<Jinx::Impl::Script::ExecutionFrame,_4096UL,_16UL>_>
           ::back(&this->m_execution);
  peVar2 = std::
           __shared_ptr_access<Jinx::Impl::FunctionDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<Jinx::Impl::FunctionDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)fnDef);
  sVar3 = FunctionDefinition::GetOffset(peVar2);
  BinaryReader::Seek(&pvVar1->reader,sVar3);
  sVar4 = std::vector<Jinx::Variant,_Jinx::StaticAllocator<Jinx::Variant,_4096UL,_16UL>_>::size
                    (&this->m_stack);
  peVar2 = std::
           __shared_ptr_access<Jinx::Impl::FunctionDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<Jinx::Impl::FunctionDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)fnDef);
  sVar3 = FunctionDefinition::GetParameterCount(peVar2);
  if (sVar3 <= sVar4) {
    sVar4 = std::vector<Jinx::Variant,_Jinx::StaticAllocator<Jinx::Variant,_4096UL,_16UL>_>::size
                      (&this->m_stack);
    peVar2 = std::
             __shared_ptr_access<Jinx::Impl::FunctionDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<Jinx::Impl::FunctionDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)fnDef);
    sVar3 = FunctionDefinition::GetParameterCount(peVar2);
    pvVar1 = std::
             vector<Jinx::Impl::Script::ExecutionFrame,_Jinx::StaticAllocator<Jinx::Impl::Script::ExecutionFrame,_4096UL,_16UL>_>
             ::back(&this->m_execution);
    pvVar1->stackTop = sVar4 - sVar3;
    return;
  }
  __assert_fail("m_stack.size() >= fnDef->GetParameterCount()",
                "/workspace/llm4binary/github/license_c_cmakelists/JamesBoer[P]Jinx/Source/JxScript.cpp"
                ,0x410,
                "void Jinx::Impl::Script::CallBytecodeFunction(const FunctionDefinitionPtr &, OnReturn)"
               );
}

Assistant:

inline_t void Script::CallBytecodeFunction(const FunctionDefinitionPtr & fnDef, OnReturn onReturn)
	{
		m_execution.emplace_back(fnDef);
		m_execution.back().onReturn = onReturn;
		m_execution.back().reader.Seek(fnDef->GetOffset());
		assert(m_stack.size() >= fnDef->GetParameterCount());
		m_execution.back().stackTop = m_stack.size() - fnDef->GetParameterCount();
	}